

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pSVar1;
  Table *x__1;
  LClosure *o;
  Proto *v;
  TString *source;
  Upvaldesc *pUVar2;
  LClosure *x_;
  BlockCnt bl;
  LexState lexstate;
  FuncState funcstate;
  
  o = luaF_newLclosure(L,1);
  pSVar1 = (L->top).p;
  *(LClosure **)pSVar1 = o;
  (pSVar1->val).tt_ = 'F';
  luaD_inctop(L);
  lexstate.h = luaH_new(L);
  pSVar1 = (L->top).p;
  *(Table **)pSVar1 = lexstate.h;
  (pSVar1->val).tt_ = 'E';
  luaD_inctop(L);
  v = luaF_newproto(L);
  o->p = v;
  funcstate.f = v;
  if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)o,(GCObject *)v);
  }
  source = luaS_new(L,name);
  v->source = source;
  if (((v->marked & 0x20) != 0) && ((source->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)v,(GCObject *)source);
    source = v->source;
  }
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  luaX_setinput(L,&lexstate,z,source,firstchar);
  open_func(&lexstate,&funcstate,&bl);
  setvararg(&funcstate,0);
  pUVar2 = allocupvalue(&funcstate);
  pUVar2->instack = '\x01';
  pUVar2->idx = '\0';
  pUVar2->kind = '\0';
  pUVar2->name = lexstate.envn;
  if ((((funcstate.f)->marked & 0x20) != 0) && (((lexstate.envn)->marked & 0x18) != 0)) {
    luaC_barrier_(lexstate.L,(GCObject *)funcstate.f,(GCObject *)lexstate.envn);
  }
  luaX_next(&lexstate);
  statlist(&lexstate);
  check(&lexstate,0x120);
  close_func(&lexstate);
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return o;
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue2s(L, L->top.p, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue2s(L, L->top.p, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  luaC_objbarrier(L, funcstate.f, funcstate.f->source);
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top.p--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}